

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O3

ssize_t tnt_object_add_str(tnt_stream *s,char *str,uint32_t len)

{
  int *piVar1;
  byte bVar2;
  long *plVar3;
  ssize_t sVar4;
  undefined4 *puVar5;
  undefined1 local_38 [8];
  iovec v [2];
  byte local_e;
  undefined1 local_d [2];
  undefined4 uStack_b;
  char data [6];
  
  plVar3 = *(long **)((long)s->data + 0x30);
  bVar2 = *(byte *)(plVar3 + 1);
  if (bVar2 != 0) {
    piVar1 = (int *)(*plVar3 + 8 + (ulong)(bVar2 - 1) * 0x10);
    *piVar1 = *piVar1 + 1;
  }
  if (len < 0x20) {
    puVar5 = (undefined4 *)local_d;
    local_e = (byte)len | 0xa0;
  }
  else if (len < 0x100) {
    puVar5 = (undefined4 *)((long)local_d + 1);
    local_e = 0xd9;
    _local_d = CONCAT31(stack0xfffffffffffffff4,(byte)len);
  }
  else if (len < 0x10000) {
    puVar5 = (undefined4 *)((long)local_d + 2);
    local_e = 0xda;
    _local_d = CONCAT22((undefined2)uStack_b,(ushort)len << 8 | (ushort)len >> 8);
  }
  else {
    puVar5 = (undefined4 *)((long)&uStack_b + 2);
    local_e = 0xdb;
    _local_d = len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18;
  }
  local_38 = (undefined1  [8])&local_e;
  v[0].iov_base = (void *)((long)puVar5 - (long)local_38);
  v[1].iov_base = (void *)(ulong)len;
  v[0].iov_len = (size_t)str;
  sVar4 = (*s->writev)(s,(iovec *)local_38,2);
  return sVar4;
}

Assistant:

ssize_t
tnt_object_add_str (struct tnt_stream *s, const char *str, uint32_t len)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	struct iovec v[2]; int v_sz = 2;
	char data[6], *end;
	end = mp_encode_strl(data, len);
	v[0].iov_base = data;
	v[0].iov_len  = end - data;
	v[1].iov_base = (void *)str;
	v[1].iov_len  = len;
	return s->writev(s, v, v_sz);
}